

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<int> * __thiscall tcb::rational<int>::operator/=(rational<int> *this,rational<int> *other)

{
  this->num_ = this->num_ * other->denom_;
  this->denom_ = this->denom_ * other->num_;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator/=(const rational<U>& other)
    {
        num_ *= other.denom();
        denom_ *= other.num();
        simplify();
        return *this;
    }